

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O1

void upack_duration(char **buf,DurationMsg *cmsg)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  
  pbVar3 = (byte *)*buf;
  bVar1 = *pbVar3;
  bVar2 = pbVar3[2];
  uVar4 = (uint)pbVar3[3] | (uint)pbVar3[1] << 0x10 | (uint)((ulong)bVar2 << 8) |
          (uint)bVar1 << 0x18;
  *buf = (char *)(pbVar3 + 4);
  if (-1 < (int)((uint)bVar1 << 0x18)) {
    cmsg->duration = uVar4;
    return;
  }
  eprintf("Unpacked value (%u) too big for cmsg->duration, max allowed %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x122,(ulong)uVar4,0x7fffffff,(ulong)bVar2 << 8,pbVar3 + 4);
}

Assistant:

static ck_uint32 upack_int(char **buf)
{
    unsigned char *ubuf = (unsigned char *)*buf;
    ck_uint32 uval;

    uval =
        (ck_uint32) ((ubuf[0] << 24) | (ubuf[1] << 16) | (ubuf[2] << 8) |
                     ubuf[3]);

    *buf += 4;

    return uval;
}